

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPGetBoolNodeValue
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaBasicItemPtr ownerItem,xmlNodePtr node)

{
  int iVar1;
  xmlChar *str1;
  xmlSchemaTypePtr type;
  int local_2c;
  int res;
  xmlChar *value;
  xmlNodePtr node_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  str1 = xmlNodeGetContent(node);
  iVar1 = xmlStrEqual(str1,(xmlChar *)"true");
  if (iVar1 == 0) {
    iVar1 = xmlStrEqual(str1,(xmlChar *)"false");
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(str1,"1");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(str1,"0");
        if (iVar1 == 0) {
          type = xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN);
          xmlSchemaPSimpleTypeErr
                    (ctxt,XML_SCHEMAP_INVALID_BOOLEAN,ownerItem,node,type,(char *)0x0,str1,
                     (char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
        local_2c = 0;
      }
      else {
        local_2c = 1;
      }
    }
    else {
      local_2c = 0;
    }
  }
  else {
    local_2c = 1;
  }
  if (str1 != (xmlChar *)0x0) {
    (*xmlFree)(str1);
  }
  return local_2c;
}

Assistant:

static int
xmlSchemaPGetBoolNodeValue(xmlSchemaParserCtxtPtr ctxt,
			   xmlSchemaBasicItemPtr ownerItem,
			   xmlNodePtr node)
{
    xmlChar *value = NULL;
    int res = 0;

    value = xmlNodeGetContent(node);
    /*
    * 3.2.2.1 Lexical representation
    * An instance of a datatype that is defined as `boolean`
    * can have the following legal literals {true, false, 1, 0}.
    */
    if (xmlStrEqual(BAD_CAST value, BAD_CAST "true"))
        res = 1;
    else if (xmlStrEqual(BAD_CAST value, BAD_CAST "false"))
        res = 0;
    else if (xmlStrEqual(BAD_CAST value, BAD_CAST "1"))
	res = 1;
    else if (xmlStrEqual(BAD_CAST value, BAD_CAST "0"))
        res = 0;
    else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_INVALID_BOOLEAN,
	    ownerItem, node,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN),
	    NULL, BAD_CAST value,
	    NULL, NULL, NULL);
    }
    if (value != NULL)
	xmlFree(value);
    return (res);
}